

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O0

void __thiscall
Rml::ControlledLifetimeResource<Rml::CoreData>::Initialize
          (ControlledLifetimeResource<Rml::CoreData> *this)

{
  code *pcVar1;
  bool bVar2;
  CoreData *this_00;
  ControlledLifetimeResource<Rml::CoreData> *this_local;
  
  if ((this->pointer != (CoreData *)0x0) &&
     (bVar2 = Assert("Resource already initialized.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x2e), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this_00 = (CoreData *)operator_new(0x68);
  memset(this_00,0,0x68);
  CoreData::CoreData(this_00);
  this->pointer = this_00;
  return;
}

Assistant:

void Initialize()
	{
		RMLUI_ASSERTMSG(!pointer, "Resource already initialized.");
		pointer = new T();
	}